

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerBegin(Pager *pPager,int exFlag,int subjInMemory)

{
  int iVar1;
  int local_24;
  int rc;
  int subjInMemory_local;
  int exFlag_local;
  Pager *pPager_local;
  
  local_24 = 0;
  if (pPager->errCode == 0) {
    pPager->subjInMemory = (u8)subjInMemory;
    if (pPager->eState == '\x01') {
      if (pPager->pWal == (Wal *)0x0) {
        local_24 = pagerLockDb(pPager,2);
        if ((local_24 == 0) && (exFlag != 0)) {
          local_24 = pager_wait_on_lock(pPager,4);
        }
      }
      else {
        if ((pPager->exclusiveMode != '\0') &&
           (iVar1 = sqlite3WalExclusiveMode(pPager->pWal,-1), iVar1 != 0)) {
          iVar1 = pagerLockDb(pPager,4);
          if (iVar1 != 0) {
            return iVar1;
          }
          sqlite3WalExclusiveMode(pPager->pWal,1);
        }
        local_24 = sqlite3WalBeginWriteTransaction(pPager->pWal);
      }
      if (local_24 == 0) {
        pPager->eState = '\x02';
        pPager->dbHintSize = pPager->dbSize;
        pPager->dbFileSize = pPager->dbSize;
        pPager->dbOrigSize = pPager->dbSize;
        pPager->journalOff = 0;
      }
    }
    pPager_local._4_4_ = local_24;
  }
  else {
    pPager_local._4_4_ = pPager->errCode;
  }
  return pPager_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerBegin(Pager *pPager, int exFlag, int subjInMemory){
  int rc = SQLITE_OK;

  if( pPager->errCode ) return pPager->errCode;
  assert( pPager->eState>=PAGER_READER && pPager->eState<PAGER_ERROR );
  pPager->subjInMemory = (u8)subjInMemory;

  if( pPager->eState==PAGER_READER ){
    assert( pPager->pInJournal==0 );

    if( pagerUseWal(pPager) ){
      /* If the pager is configured to use locking_mode=exclusive, and an
      ** exclusive lock on the database is not already held, obtain it now.
      */
      if( pPager->exclusiveMode && sqlite3WalExclusiveMode(pPager->pWal, -1) ){
        rc = pagerLockDb(pPager, EXCLUSIVE_LOCK);
        if( rc!=SQLITE_OK ){
          return rc;
        }
        (void)sqlite3WalExclusiveMode(pPager->pWal, 1);
      }

      /* Grab the write lock on the log file. If successful, upgrade to
      ** PAGER_RESERVED state. Otherwise, return an error code to the caller.
      ** The busy-handler is not invoked if another connection already
      ** holds the write-lock. If possible, the upper layer will call it.
      */
      rc = sqlite3WalBeginWriteTransaction(pPager->pWal);
    }else{
      /* Obtain a RESERVED lock on the database file. If the exFlag parameter
      ** is true, then immediately upgrade this to an EXCLUSIVE lock. The
      ** busy-handler callback can be used when upgrading to the EXCLUSIVE
      ** lock, but not when obtaining the RESERVED lock.
      */
      rc = pagerLockDb(pPager, RESERVED_LOCK);
      if( rc==SQLITE_OK && exFlag ){
        rc = pager_wait_on_lock(pPager, EXCLUSIVE_LOCK);
      }
    }

    if( rc==SQLITE_OK ){
      /* Change to WRITER_LOCKED state.
      **
      ** WAL mode sets Pager.eState to PAGER_WRITER_LOCKED or CACHEMOD
      ** when it has an open transaction, but never to DBMOD or FINISHED.
      ** This is because in those states the code to roll back savepoint
      ** transactions may copy data from the sub-journal into the database
      ** file as well as into the page cache. Which would be incorrect in
      ** WAL mode.
      */
      pPager->eState = PAGER_WRITER_LOCKED;
      pPager->dbHintSize = pPager->dbSize;
      pPager->dbFileSize = pPager->dbSize;
      pPager->dbOrigSize = pPager->dbSize;
      pPager->journalOff = 0;
    }

    assert( rc==SQLITE_OK || pPager->eState==PAGER_READER );
    assert( rc!=SQLITE_OK || pPager->eState==PAGER_WRITER_LOCKED );
    assert( assert_pager_state(pPager) );
  }

  PAGERTRACE(("TRANSACTION %d\n", PAGERID(pPager)));
  return rc;
}